

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O1

int Bac_PtrMemory(Vec_Ptr_t *vDes)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  if (vDes == (Vec_Ptr_t *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = vDes->nCap;
    auVar4._8_4_ = iVar2 >> 0x1f;
    auVar4._0_8_ = (long)iVar2;
    auVar4._12_4_ = 0x45300000;
    iVar2 = (int)(((auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 8.0 + 16.0);
  }
  if (1 < vDes->nSize) {
    lVar3 = 1;
    do {
      iVar1 = Bac_PtrMemoryNtk((Vec_Ptr_t *)vDes->pArray[lVar3]);
      iVar2 = iVar2 + iVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vDes->nSize);
  }
  return iVar2;
}

Assistant:

int Bac_PtrMemory( Vec_Ptr_t * vDes )
{
    Vec_Ptr_t * vNtk; int i, nBytes = (int)Vec_PtrMemory(vDes);
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        nBytes += Bac_PtrMemoryNtk(vNtk);
    return nBytes;
}